

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Module * codegen(Module *__return_storage_ptr__,Module *irModule)

{
  Module local_60;
  
  mocker::runInstructionSelection(__return_storage_ptr__,irModule);
  std::operator<<((ostream *)&std::cerr,"\nNASM:\n");
  std::operator<<((ostream *)&std::cerr,"After instruction selection:\n");
  local_60.directives.
  super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)__return_storage_ptr__;
  printNasmStats((Stats *)&local_60);
  mocker::allocateRegisters(&local_60,__return_storage_ptr__);
  mocker::nasm::Module::operator=(__return_storage_ptr__,&local_60);
  mocker::nasm::Module::~Module(&local_60);
  std::operator<<((ostream *)&std::cerr,"\nAfter register allocation:\n");
  local_60.directives.
  super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)__return_storage_ptr__;
  printNasmStats((Stats *)&local_60);
  mocker::runPeepholeOptimization(&local_60,__return_storage_ptr__);
  mocker::nasm::Module::operator=(__return_storage_ptr__,&local_60);
  mocker::nasm::Module::~Module(&local_60);
  std::operator<<((ostream *)&std::cerr,"\nAfter peephole optimization:\n");
  local_60.directives.
  super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)__return_storage_ptr__;
  printNasmStats((Stats *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

mocker::nasm::Module codegen(const mocker::ir::Module &irModule) {
  using namespace mocker;
  auto res = runInstructionSelection(irModule);
  //  nasm::printModule(res);

  std::cerr << "\nNASM:\n";
  std::cerr << "After instruction selection:\n";
  printNasmStats(nasm::Stats(res));

  res = allocateRegisters(res);
  //  res = allocateRegistersNaively(res);
  std::cerr << "\nAfter register allocation:\n";
  printNasmStats(nasm::Stats(res));

  //  nasm::printModule(res, std::cerr);

  res = runPeepholeOptimization(res);
  std::cerr << "\nAfter peephole optimization:\n";
  printNasmStats(nasm::Stats(res));
  return res;
}